

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall parser::Parser::popOperator(Parser *this,bool isBinary)

{
  stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_> *this_00;
  _Map_pointer pppEVar1;
  Expr **ppEVar2;
  Expr *in_RAX;
  _Elt_pointer ppEVar3;
  Expr **ppEVar4;
  Expr *e1;
  _Elt_pointer ppVar5;
  ulong uVar6;
  Expr *e2;
  Expr *local_28;
  
  pppEVar1 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node;
  this_00 = &this->Operands;
  ppEVar4 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  ppEVar2 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first;
  uVar6 = ((long)(this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)ppEVar4 - (long)ppEVar2 >> 3) +
          ((((ulong)((long)pppEVar1 -
                    (long)(this->Operands).c.
                          super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppEVar1 == (_Map_pointer)0x0)) * 0x40;
  if (uVar6 < 2 || !isBinary) {
    local_28 = in_RAX;
    if (uVar6 == 0) goto LAB_00123e7e;
    if (ppEVar4 == ppEVar2) {
      ppEVar4 = pppEVar1[-1] + 0x40;
    }
    e2 = ppEVar4[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppVar5 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar5 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar5 = (this->Operators).c.
               super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    e1 = (Expr *)0x0;
  }
  else {
    if (ppEVar4 == ppEVar2) {
      ppEVar4 = pppEVar1[-1] + 0x40;
    }
    e2 = ppEVar4[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppEVar3 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar3 ==
        (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppEVar3 = (this->Operands).c.super__Deque_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    e1 = ppEVar3[-1];
    std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>::pop_back(&this_00->c);
    ppVar5 = (this->Operators).c.
             super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar5 == (this->Operators).c.
                  super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar5 = (this->Operators).c.
               super__Deque_base<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
  }
  local_28 = mkNode(this,&ppVar5[-1].second,e1,e2);
  std::deque<ast::Expr*,std::allocator<ast::Expr*>>::emplace_back<ast::Expr*>
            ((deque<ast::Expr*,std::allocator<ast::Expr*>> *)this_00,&local_28);
LAB_00123e7e:
  std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>::pop_back
            (&(this->Operators).c);
  return;
}

Assistant:

void Parser::popOperator(bool isBinary)
{

    if(Operands.size() >= 2 && isBinary)
    {
      auto e2 = Operands.top();
      Operands.pop();
      auto e1 = Operands.top();
      Operands.pop();
      Operands.push(mkNode(Operators.top().second, e1, e2));
    }else if(Operands.size() > 0){
        auto e2 = Operands.top();
        Operands.pop();
        Operands.push(mkNode(Operators.top().second, nullptr, e2));
    }
    Operators.pop();
}